

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
libcellml::Analyser::AnalyserImpl::updateUnitsMap
          (AnalyserImpl *this,ModelPtr *model,string *unitsName,UnitsMap *unitsMap,bool userUnitsMap
          ,double unitsExponent,double unitsMultiplier)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  AnalyserImpl *pAVar6;
  undefined7 in_register_00000081;
  size_t i;
  ulong index;
  double dVar7;
  UnitsPtr units;
  double multiplier;
  double exponent;
  string id;
  string prefix;
  string reference;
  double local_c8;
  Model local_c0;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  pointer local_50;
  pointer local_48;
  undefined1 local_40;
  
  local_c8 = unitsExponent;
  local_c0.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)unitsMultiplier;
  if ((int)CONCAT71(in_register_00000081,userUnitsMap) == 0) {
    pAVar6 = (AnalyserImpl *)unitsName;
    bVar1 = isStandardUnitName(unitsName);
    if (bVar1) {
      updateUnitsMapWithStandardUnit(pAVar6,unitsName,unitsMap,unitsExponent);
      return;
    }
    Model::units(&local_c0,
                 (string *)
                 (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    bVar1 = Units::isBaseUnit((Units *)local_c0.super_ComponentEntity.super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity);
    if (bVar1) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              ::find(&unitsMap->_M_t,unitsName);
      dVar7 = local_c8;
      if ((_Rb_tree_header *)iVar3._M_node == &(unitsMap->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,double&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                    *)unitsMap,unitsName,&local_c8);
      }
      else {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](unitsMap,(key_type *)(iVar3._M_node + 1));
        *pmVar4 = dVar7 + *pmVar4;
      }
    }
    else {
      local_50 = (pointer)&stack0xffffffffffffffc0;
      local_48 = (pointer)0x0;
      index = 0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_40 = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_90.field_2._M_local_buf[0] = '\0';
      while( true ) {
        sVar5 = Units::unitCount((Units *)local_c0.super_ComponentEntity.super_NamedEntity.
                                          super_ParentedEntity.super_Entity._vptr_Entity);
        if (sVar5 <= index) break;
        Units::unitAttributes
                  ((Units *)local_c0.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                            super_Entity._vptr_Entity,index,(string *)&stack0xffffffffffffffb0,
                   &local_70,&local_98,&local_a0,&local_90);
        pAVar6 = (AnalyserImpl *)&stack0xffffffffffffffb0;
        bVar1 = isStandardUnitName((string *)&stack0xffffffffffffffb0);
        dVar7 = local_c8 * local_98;
        if (bVar1) {
          updateUnitsMapWithStandardUnit(pAVar6,(string *)&stack0xffffffffffffffb0,unitsMap,dVar7);
        }
        else {
          local_c0.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)log10(local_a0);
          iVar2 = convertPrefixToInt(&local_70,(bool *)0x0);
          updateUnitsMap(this,model,(string *)&stack0xffffffffffffffb0,unitsMap,false,dVar7,
                         ((double)local_c0.super_enable_shared_from_this<libcellml::Model>.
                                  _M_weak_this.
                                  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + (double)iVar2) * local_c8 +
                         (double)local_c0.super_enable_shared_from_this<libcellml::Model>.
                                 _M_weak_this.
                                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
        }
        index = index + 1;
      }
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_c0.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl);
  }
  else {
    bVar1 = std::operator!=(unitsName,"dimensionless");
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,double&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)unitsMap,unitsName,&local_c8);
    }
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::updateUnitsMap(const ModelPtr &model,
                                            const std::string &unitsName,
                                            UnitsMap &unitsMap,
                                            bool userUnitsMap,
                                            double unitsExponent,
                                            double unitsMultiplier)
{
    // Update the given units map using the given information.

    if (userUnitsMap) {
        if (unitsName != "dimensionless") {
            unitsMap.emplace(unitsName, unitsExponent);
        }
    } else {
        if (isStandardUnitName(unitsName)) {
            updateUnitsMapWithStandardUnit(unitsName, unitsMap, unitsExponent);
        } else {
            UnitsPtr units = model->units(unitsName);

            if (units->isBaseUnit()) {
                auto iter = unitsMap.find(unitsName);

                if (iter == unitsMap.end()) {
                    unitsMap.emplace(unitsName, unitsExponent);
                } else {
                    unitsMap[iter->first] += unitsExponent;
                }
            } else {
                std::string reference;
                std::string prefix;
                double exponent;
                double multiplier;
                std::string id;

                for (size_t i = 0; i < units->unitCount(); ++i) {
                    units->unitAttributes(i, reference, prefix, exponent, multiplier, id);

                    if (isStandardUnitName(reference)) {
                        updateUnitsMapWithStandardUnit(reference, unitsMap, exponent * unitsExponent);
                    } else {
                        updateUnitsMap(model, reference, unitsMap, userUnitsMap,
                                       exponent * unitsExponent,
                                       unitsMultiplier + (std::log10(multiplier) + convertPrefixToInt(prefix)) * unitsExponent);
                    }
                }
            }
        }
    }
}